

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_storage.cpp
# Opt level: O3

uint ChannelsFromFmt(FmtChannels chans,uint ambiorder)

{
  undefined3 in_register_00000039;
  
  switch(CONCAT31(in_register_00000039,chans)) {
  case 0:
    return 1;
  case 1:
  case 2:
    return 2;
  case 3:
    return 4;
  case 4:
    return 6;
  case 5:
    return 7;
  case 6:
    return 8;
  case 7:
    return ambiorder * 2 + 1;
  case 8:
    return (ambiorder + 1) * (ambiorder + 1);
  default:
    return 0;
  }
}

Assistant:

uint ChannelsFromFmt(FmtChannels chans, uint ambiorder) noexcept
{
    switch(chans)
    {
    case FmtMono: return 1;
    case FmtStereo: return 2;
    case FmtRear: return 2;
    case FmtQuad: return 4;
    case FmtX51: return 6;
    case FmtX61: return 7;
    case FmtX71: return 8;
    case FmtBFormat2D: return (ambiorder*2) + 1;
    case FmtBFormat3D: return (ambiorder+1) * (ambiorder+1);
    }
    return 0;
}